

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# power.c
# Opt level: O3

int envy_bios_parse_power_boost(envy_bios *bios)

{
  uint8_t uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  envy_bios_power_boost_entry *peVar5;
  ulong uVar6;
  envy_bios_power_boost_subentry *peVar7;
  uint32_t uVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  ulong uVar12;
  uint uVar13;
  byte bVar14;
  ulong uVar15;
  long lVar16;
  int local_44;
  
  uVar13 = (bios->power).boost.offset;
  if ((ulong)uVar13 == 0) {
    local_44 = -0x16;
  }
  else {
    if (uVar13 < bios->length) {
      uVar1 = bios->data[uVar13];
      (bios->power).boost.version = uVar1;
    }
    else {
      (bios->power).boost.version = '\0';
      fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
      uVar1 = (bios->power).boost.version;
    }
    if (uVar1 == '\x11') {
      uVar8 = (bios->power).boost.offset;
      uVar13 = uVar8 + 1;
      uVar10 = bios->length;
      if (uVar13 < uVar10) {
        (bios->power).boost.hlen = bios->data[uVar13];
        uVar13 = 0;
      }
      else {
        (bios->power).boost.hlen = '\0';
        fprintf(_stderr,"requested OOB u8 at 0x%04x\n",(ulong)uVar13);
        uVar8 = (bios->power).boost.offset;
        uVar10 = bios->length;
        uVar13 = 0xfffffff2;
      }
      uVar11 = uVar8 + 2;
      if (uVar11 < uVar10) {
        (bios->power).boost.rlen = bios->data[uVar11];
        uVar11 = 0;
      }
      else {
        (bios->power).boost.rlen = '\0';
        fprintf(_stderr,"requested OOB u8 at 0x%04x\n",(ulong)uVar11);
        uVar8 = (bios->power).boost.offset;
        uVar10 = bios->length;
        uVar11 = 0xfffffff2;
      }
      uVar2 = uVar8 + 3;
      if (uVar2 < uVar10) {
        (bios->power).boost.ssz = bios->data[uVar2];
        uVar2 = 0;
      }
      else {
        (bios->power).boost.ssz = '\0';
        fprintf(_stderr,"requested OOB u8 at 0x%04x\n",(ulong)uVar2);
        uVar8 = (bios->power).boost.offset;
        uVar10 = bios->length;
        uVar2 = 0xfffffff2;
      }
      uVar3 = uVar8 + 4;
      if (uVar3 < uVar10) {
        (bios->power).boost.snr = bios->data[uVar3];
        uVar3 = 0;
      }
      else {
        (bios->power).boost.snr = '\0';
        fprintf(_stderr,"requested OOB u8 at 0x%04x\n",(ulong)uVar3);
        uVar8 = (bios->power).boost.offset;
        uVar10 = bios->length;
        uVar3 = 0xfffffff2;
      }
      if (uVar8 + 5 < uVar10) {
        (bios->power).boost.entriesnum = bios->data[uVar8 + 5];
        uVar10 = 0;
      }
      else {
        (bios->power).boost.entriesnum = '\0';
        fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
        uVar10 = 0xfffffff2;
      }
      uVar10 = uVar11 | uVar13 | uVar2 | uVar3 | uVar10;
    }
    else {
      if (uVar1 != '\x10') {
        envy_bios_parse_power_boost_cold_1();
        return -0x16;
      }
      uVar8 = (bios->power).boost.offset;
      uVar13 = uVar8 + 1;
      uVar10 = bios->length;
      if (uVar13 < uVar10) {
        (bios->power).boost.hlen = bios->data[uVar13];
        uVar13 = 0;
      }
      else {
        (bios->power).boost.hlen = '\0';
        fprintf(_stderr,"requested OOB u8 at 0x%04x\n",(ulong)uVar13);
        uVar8 = (bios->power).boost.offset;
        uVar10 = bios->length;
        uVar13 = 0xfffffff2;
      }
      uVar11 = uVar8 + 2;
      if (uVar11 < uVar10) {
        (bios->power).boost.rlen = bios->data[uVar11];
        uVar11 = 0;
      }
      else {
        (bios->power).boost.rlen = '\0';
        fprintf(_stderr,"requested OOB u8 at 0x%04x\n",(ulong)uVar11);
        uVar8 = (bios->power).boost.offset;
        uVar10 = bios->length;
        uVar11 = 0xfffffff2;
      }
      if (uVar8 + 3 < uVar10) {
        (bios->power).boost.entriesnum = bios->data[uVar8 + 3];
        uVar10 = 0;
      }
      else {
        (bios->power).boost.entriesnum = '\0';
        fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
        uVar10 = 0xfffffff2;
      }
      uVar10 = uVar11 | uVar13 | uVar10;
      (bios->power).boost.snr = '\0';
      (bios->power).boost.ssz = '\0';
    }
    (bios->power).boost.valid = uVar10 == 0;
    bVar14 = (bios->power).boost.entriesnum;
    peVar5 = (envy_bios_power_boost_entry *)malloc((ulong)((uint)bVar14 * 8) * 3);
    (bios->power).boost.entries = peVar5;
    if (bVar14 == 0) {
      local_44 = 0;
    }
    else {
      uVar6 = (ulong)(bios->power).boost.snr;
      uVar12 = 0;
      do {
        iVar9 = (uint)(bios->power).boost.hlen + (bios->power).boost.offset;
        iVar4 = (int)uVar12 *
                ((uint)(bios->power).boost.ssz * (int)uVar6 + (uint)(bios->power).boost.rlen);
        uVar10 = iVar4 + iVar9 + 1;
        uVar11 = iVar9 + iVar4;
        uVar13 = bios->length;
        if (uVar10 < uVar13) {
          bVar14 = (byte)(CONCAT11(bios->data[uVar10],bios->data[uVar11]) >> 5) & 0xf;
        }
        else {
          bVar14 = 0;
          fprintf(_stderr,"requested OOB u16 at 0x%04x\n",(ulong)uVar11);
          uVar13 = bios->length;
        }
        peVar5 = (bios->power).boost.entries;
        if (uVar11 + 3 < uVar13) {
          peVar5[uVar12].min = CONCAT11(bios->data[uVar11 + 3],bios->data[uVar11 + 2]);
        }
        else {
          peVar5[uVar12].min = 0;
          fprintf(_stderr,"requested OOB u16 at 0x%04x\n");
          peVar5 = (bios->power).boost.entries;
          uVar13 = bios->length;
        }
        if (uVar11 + 5 < uVar13) {
          peVar5[uVar12].max = CONCAT11(bios->data[uVar11 + 5],bios->data[uVar11 + 4]);
        }
        else {
          peVar5[uVar12].max = 0;
          fprintf(_stderr,"requested OOB u16 at 0x%04x\n");
          peVar5 = (bios->power).boost.entries;
        }
        peVar5[uVar12].offset = uVar11;
        peVar5[uVar12].pstate = bVar14;
        bVar14 = (bios->power).boost.snr;
        peVar7 = (envy_bios_power_boost_subentry *)malloc((ulong)((uint)bVar14 * 4) * 3);
        local_44 = 0;
        peVar5[uVar12].entries = peVar7;
        if (bVar14 == 0) {
          uVar6 = 0;
        }
        else {
          lVar16 = 8;
          uVar15 = 0;
          do {
            peVar7 = (bios->power).boost.entries[uVar12].entries;
            uVar13 = (uint)(bios->power).boost.ssz * (int)uVar15 + (bios->power).boost.rlen + uVar11
            ;
            *(uint *)((long)peVar7 + lVar16 + -8) = uVar13;
            if (uVar13 < bios->length) {
              *(uint8_t *)((long)peVar7 + lVar16 + -4) = bios->data[uVar13];
            }
            else {
              *(undefined1 *)((long)peVar7 + lVar16 + -4) = 0;
              fprintf(_stderr,"requested OOB u8 at 0x%04x\n",(ulong)uVar13);
            }
            if (uVar13 + 1 < bios->length) {
              *(uint8_t *)((long)peVar7 + lVar16 + -3) = bios->data[uVar13 + 1];
            }
            else {
              *(undefined1 *)((long)peVar7 + lVar16 + -3) = 0;
              fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
            }
            uVar10 = bios->length;
            if (uVar13 + 3 < uVar10) {
              *(ushort *)((long)peVar7 + lVar16 + -2) =
                   CONCAT11(bios->data[uVar13 + 3],bios->data[uVar13 + 2]);
            }
            else {
              *(undefined2 *)((long)peVar7 + lVar16 + -2) = 0;
              fprintf(_stderr,"requested OOB u16 at 0x%04x\n");
              uVar10 = bios->length;
            }
            if (uVar13 + 5 < uVar10) {
              *(ushort *)((long)&peVar7->offset + lVar16) =
                   CONCAT11(bios->data[uVar13 + 5],bios->data[uVar13 + 4]);
            }
            else {
              *(undefined2 *)((long)&peVar7->offset + lVar16) = 0;
              fprintf(_stderr,"requested OOB u16 at 0x%04x\n");
            }
            uVar15 = uVar15 + 1;
            uVar6 = (ulong)(bios->power).boost.snr;
            lVar16 = lVar16 + 0xc;
          } while (uVar15 < uVar6);
        }
        uVar12 = uVar12 + 1;
      } while (uVar12 < (bios->power).boost.entriesnum);
    }
  }
  return local_44;
}

Assistant:

int envy_bios_parse_power_boost(struct envy_bios *bios) {
	struct envy_bios_power_boost *boost = &bios->power.boost;
	int i, j, err = 0;

	if (!boost->offset)
		return -EINVAL;

	bios_u8(bios, boost->offset + 0x0, &boost->version);
	switch(boost->version) {
	case 0x10:
		err |= bios_u8(bios, boost->offset + 0x1, &boost->hlen);
		err |= bios_u8(bios, boost->offset + 0x2, &boost->rlen);
		err |= bios_u8(bios, boost->offset + 0x3, &boost->entriesnum);
		boost->ssz = 0;
		boost->snr = 0;
		boost->valid = !err;
		break;
	case 0x11:
		err |= bios_u8(bios, boost->offset + 0x1, &boost->hlen);
		err |= bios_u8(bios, boost->offset + 0x2, &boost->rlen);
		err |= bios_u8(bios, boost->offset + 0x3, &boost->ssz);
		err |= bios_u8(bios, boost->offset + 0x4, &boost->snr);
		err |= bios_u8(bios, boost->offset + 0x5, &boost->entriesnum);
		boost->valid = !err;
		break;
	default:
		ENVY_BIOS_ERR("Unknown BOOST table version 0x%x\n", boost->version);
		return -EINVAL;
	};

	boost->entries = malloc(boost->entriesnum * sizeof(struct envy_bios_power_boost_entry));

	for (i = 0; i < boost->entriesnum; i++) {
		uint32_t data = boost->offset + boost->hlen + i * (boost->rlen + (boost->snr * boost->ssz));

		uint16_t tmp;
		err |= bios_u16(bios, data + 0x0, &tmp);
		err |= bios_u16(bios, data + 0x2, &boost->entries[i].min);
		err |= bios_u16(bios, data + 0x4, &boost->entries[i].max);

		boost->entries[i].offset = data;
		boost->entries[i].pstate = (tmp & 0x01e0) >> 5;

		boost->entries[i].entries = malloc(boost->snr * sizeof(struct envy_bios_power_boost_subentry));

		for (j = 0; j < boost->snr; j++) {
			struct envy_bios_power_boost_subentry *sub = &boost->entries[i].entries[j];
			uint32_t sdata = data + boost->rlen + j * boost->ssz;

			sub->offset = sdata;
			bios_u8(bios, sdata + 0x0, &sub->domain);
			bios_u8(bios, sdata + 0x1, &sub->percent);
			bios_u16(bios, sdata + 0x2, &sub->min);
			bios_u16(bios, sdata + 0x4, &sub->max);
		}
	}

	return 0;
}